

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O3

void mon_set_minvis(monst *mon)

{
  uint uVar1;
  
  uVar1 = *(uint *)&mon->field_0x60;
  *(uint *)&mon->field_0x60 = uVar1 | 8;
  if ((uVar1 & 4) == 0) {
    *(uint *)&mon->field_0x60 = uVar1 | 10;
    if (mon->data == mons + 0x153) {
      unblock_point((int)mon->mx,(int)mon->my);
    }
    newsym((int)mon->mx,(int)mon->my);
    if (mon->wormno != '\0') {
      see_wsegs(mon);
      return;
    }
  }
  return;
}

Assistant:

void mon_set_minvis(struct monst *mon)
{
	mon->perminvis = 1;
	if (!mon->invis_blkd) {
	    mon->minvis = 1;
	    if (mon->data == &mons[PM_GIANT_TURTLE])
		unblock_point(mon->mx, mon->my);
	    newsym(mon->mx, mon->my);		/* make it disappear */
	    if (mon->wormno) see_wsegs(mon);	/* and any tail too */
	}
}